

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  bool bVar1;
  int value;
  type tVar2;
  size_t sVar3;
  char (*in_R8) [3];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_40;
  buffer_appender<char> it;
  long lStack_30;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *pbStack_20;
  int error_code_local;
  buffer<char> *out_local;
  string_view message_local;
  
  message_local.data_ = (char *)message.size_;
  out_local = (buffer<char> *)message.data_;
  error_code_size._4_4_ = error_code;
  pbStack_20 = out;
  buffer<char>::try_resize(out,0);
  lStack_30 = 8;
  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
       error_code_size._4_4_;
  bVar1 = is_negative<int,_0>(error_code_size._4_4_);
  if (bVar1) {
    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         -it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_;
    lStack_30 = 9;
  }
  value = count_digits(it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_
                      );
  tVar2 = to_unsigned<int>(value);
  buffer_appender<char>::buffer_appender((buffer_appender<char> *)&local_40,pbStack_20);
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&out_local);
  if (sVar3 <= 500 - (lStack_30 + (ulong)tVar2)) {
    format_to<fmt::v7::detail::buffer_appender<char>,_char[5],_fmt::v7::basic_string_view<char>_&,_const_char_(&)[3],_0>
              ((v7 *)local_40.container,(buffer_appender<char>)0x42743c,(char (*) [5])&out_local,
               (basic_string_view<char> *)": ",in_R8);
  }
  format_to<fmt::v7::detail::buffer_appender<char>,_char[5],_const_char_(&)[7],_int_&,_0>
            ((v7 *)local_40.container,(buffer_appender<char>)0x42743c,(char (*) [5])"error ",
             (char (*) [7])((long)&error_code_size + 4),(int *)in_R8);
  sVar3 = buffer<char>::size(pbStack_20);
  if (500 < sVar3) {
    __assert_fail("out.size() <= inline_buffer_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0xa3,
                  "void fmt::detail::format_error_code(detail::buffer<char> &, int, string_view)");
  }
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, "{}{}", message, SEP);
  format_to(it, "{}{}", ERROR_STR, error_code);
  assert(out.size() <= inline_buffer_size);
}